

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_tointg(ASMState *as,IRIns *ir,Reg left)

{
  Reg r2;
  Reg r2_00;
  
  r2 = ra_scratch(as,~(1 << (left & 0x1f)) & 0xffff0000);
  r2_00 = ra_dest(as,ir,0xffef);
  asm_guardcc(as,10);
  asm_guardcc(as,5);
  emit_rr(as,XO_UCOMISD,left,r2);
  emit_rr(as,XO_CVTSI2SD,r2,r2_00);
  emit_rr(as,XO_XORPS,r2,r2);
  if (as->mclim <= as->mcp) {
    emit_rr(as,XO_CVTTSD2SI,r2_00,left);
    return;
  }
  asm_mclimit(as);
}

Assistant:

static void asm_tointg(ASMState *as, IRIns *ir, Reg left)
{
  Reg tmp = ra_scratch(as, rset_exclude(RSET_FPR, left));
  Reg dest = ra_dest(as, ir, RSET_GPR);
  asm_guardcc(as, CC_P);
  asm_guardcc(as, CC_NE);
  emit_rr(as, XO_UCOMISD, left, tmp);
  emit_rr(as, XO_CVTSI2SD, tmp, dest);
  emit_rr(as, XO_XORPS, tmp, tmp);  /* Avoid partial register stall. */
  checkmclim(as);
  emit_rr(as, XO_CVTTSD2SI, dest, left);
  /* Can't fuse since left is needed twice. */
}